

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O3

long testCreateQuoteRequest(int count)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  NoRelatedSym noRelatedSym;
  Currency currency;
  MaturityMonthYear maturityMonthYear;
  Symbol symbol;
  OrderQty orderQty;
  Side side;
  StrikePrice strikePrice;
  PutOrCall putOrCall;
  OrdType ordType;
  QuoteRequest massQuote;
  long *local_4f8;
  long local_4f0;
  long local_4e8 [2];
  int local_4d8;
  int local_4d4;
  long local_4d0;
  long local_4c8;
  undefined1 local_4c0 [16];
  _Alloc_hider local_4b0;
  char local_4a0 [16];
  _Alloc_hider local_490;
  size_type local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  field_metrics local_470;
  uint local_450;
  undefined1 local_448 [48];
  _Alloc_hider local_418;
  size_type local_410;
  field_metrics local_3f8;
  undefined1 local_3f0 [48];
  _Alloc_hider local_3c0;
  size_type local_3b8;
  field_metrics local_3a0;
  undefined1 local_398 [48];
  _Alloc_hider local_368;
  size_type local_360;
  field_metrics local_348;
  FieldBase local_340;
  FieldBase local_2e8;
  FieldBase local_290;
  FieldBase local_238;
  FieldBase local_1e0;
  QuoteRequest local_188;
  
  local_4d8 = count;
  gettimeofday((timeval *)&local_188,(__timezone_ptr_t)0x0);
  uVar2 = local_188.super_Message._8_8_;
  uVar1 = local_188.super_Message._0_8_;
  FIX::StringField::StringField((StringField *)local_398,0x37);
  local_398._0_8_ = &PTR__FieldBase_0011c600;
  FIX::StringField::StringField((StringField *)local_3f0,200);
  local_3f0._0_8_ = &PTR__FieldBase_0011c750;
  FIX::IntField::IntField((IntField *)&local_238,0xc9);
  local_238._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c788;
  FIX::DoubleField::DoubleField((DoubleField *)&local_290,0xca);
  local_290._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c7f8;
  FIX::CharField::CharField((CharField *)&local_2e8,0x36);
  local_2e8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c638;
  FIX::DoubleField::DoubleField((DoubleField *)&local_340,0x26);
  local_4d0 = uVar1;
  local_4c8 = uVar2;
  local_340._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c868;
  FIX::StringField::StringField((StringField *)local_448,0xf);
  local_448._0_8_ = &PTR__FieldBase_0011c8a0;
  FIX::CharField::CharField((CharField *)&local_1e0,0x28);
  local_1e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c6e0;
  if (0 < local_4d8) {
    iVar3 = 0;
    do {
      local_4f8 = local_4e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"1","");
      local_4c0._0_8_ = &PTR__FieldBase_0011c4d8;
      local_4c0._8_4_ = 0x83;
      local_4b0._M_p = local_4a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4b0,local_4f8,local_4f0 + (long)local_4f8);
      local_490._M_p = (pointer)&local_480;
      local_488 = 0;
      local_480._M_local_buf[0] = '\0';
      local_470.m_length = 0;
      local_470.m_checksum = 0;
      local_4c0._0_8_ = &PTR__FieldBase_0011c8d8;
      FIX42::QuoteRequest::QuoteRequest(&local_188,(QuoteReqID *)local_4c0);
      FIX::FieldBase::~FieldBase((FieldBase *)local_4c0);
      if (local_4f8 != local_4e8) {
        operator_delete(local_4f8,local_4e8[0] + 1);
      }
      local_4d4 = iVar3;
      FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym((NoRelatedSym *)local_4c0);
      iVar3 = 10;
      do {
        local_4f8 = local_4e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"IBM","");
        std::__cxx11::string::_M_assign((string *)(local_398 + 0x10));
        local_348.m_length = 0;
        local_348.m_checksum = 0;
        local_360 = 0;
        *local_368._M_p = '\0';
        if (local_4f8 != local_4e8) {
          operator_delete(local_4f8,local_4e8[0] + 1);
        }
        local_4f8 = local_4e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"022003","");
        std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x10));
        local_3a0.m_length = 0;
        local_3a0.m_checksum = 0;
        local_3b8 = 0;
        *local_3c0._M_p = '\0';
        if (local_4f8 != local_4e8) {
          operator_delete(local_4f8,local_4e8[0] + 1);
        }
        FIX::IntField::setValue((IntField *)&local_238,0);
        FIX::DoubleField::setValue((DoubleField *)&local_290,120.0,0);
        FIX::CharField::setValue((CharField *)&local_2e8,'1');
        FIX::DoubleField::setValue((DoubleField *)&local_340,100.0,0);
        local_4f8 = local_4e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"USD","");
        std::__cxx11::string::_M_assign((string *)(local_448 + 0x10));
        local_3f8.m_length = 0;
        local_3f8.m_checksum = 0;
        local_410 = 0;
        *local_418._M_p = '\0';
        if (local_4f8 != local_4e8) {
          operator_delete(local_4f8,local_4e8[0] + 1);
        }
        FIX::CharField::setValue((CharField *)&local_1e0,'1');
        FIX::FieldMap::setField((FieldMap *)local_4c0,(FieldBase *)local_398,true);
        FIX::FieldMap::setField((FieldMap *)local_4c0,(FieldBase *)local_3f0,true);
        FIX::FieldMap::setField((FieldMap *)local_4c0,&local_238,true);
        FIX::FieldMap::setField((FieldMap *)local_4c0,&local_290,true);
        FIX::FieldMap::setField((FieldMap *)local_4c0,&local_2e8,true);
        FIX::FieldMap::setField((FieldMap *)local_4c0,&local_340,true);
        FIX::FieldMap::setField((FieldMap *)local_4c0,(FieldBase *)local_448,true);
        FIX::FieldMap::setField((FieldMap *)local_4c0,&local_1e0,true);
        FIX::FieldMap::addGroup
                  ((int)&local_188,(FieldMap *)(ulong)local_450,SUB81((FieldBase *)local_4c0,0));
        FIX::FieldMap::clear();
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      FIX::FieldMap::~FieldMap((FieldMap *)local_4c0);
      FIX::Message::~Message((Message *)&local_188);
      iVar3 = local_4d4 + 1;
    } while (iVar3 != local_4d8);
  }
  lVar4 = local_4c8 + (long)((double)local_4d0 * 1000000.0);
  gettimeofday((timeval *)&local_188,(__timezone_ptr_t)0x0);
  FIX::FieldBase::~FieldBase(&local_1e0);
  FIX::FieldBase::~FieldBase((FieldBase *)local_448);
  FIX::FieldBase::~FieldBase(&local_340);
  FIX::FieldBase::~FieldBase(&local_2e8);
  FIX::FieldBase::~FieldBase(&local_290);
  FIX::FieldBase::~FieldBase(&local_238);
  FIX::FieldBase::~FieldBase((FieldBase *)local_3f0);
  FIX::FieldBase::~FieldBase((FieldBase *)local_398);
  return (local_188.super_Message._8_8_ - lVar4) +
         (long)((double)(long)local_188.super_Message._0_8_ * 1000000.0);
}

Assistant:

long testCreateQuoteRequest(int count) {
  count = count - 1;

  long start = GetTickCount();
  FIX::Symbol symbol;
  FIX::MaturityMonthYear maturityMonthYear;
  FIX::PutOrCall putOrCall;
  FIX::StrikePrice strikePrice;
  FIX::Side side;
  FIX::OrderQty orderQty;
  FIX::Currency currency;
  FIX::OrdType ordType;

  for (int i = 0; i <= count; ++i) {
    FIX42::QuoteRequest massQuote(FIX::QuoteReqID("1"));
    FIX42::QuoteRequest::NoRelatedSym noRelatedSym;

    for (int j = 1; j <= 10; ++j) {
      symbol.setValue("IBM");
      maturityMonthYear.setValue("022003");
      putOrCall.setValue(FIX::PutOrCall_PUT);
      strikePrice.setValue(120);
      side.setValue(FIX::Side_BUY);
      orderQty.setValue(100);
      currency.setValue("USD");
      ordType.setValue(FIX::OrdType_MARKET);
      noRelatedSym.set(symbol);
      noRelatedSym.set(maturityMonthYear);
      noRelatedSym.set(putOrCall);
      noRelatedSym.set(strikePrice);
      noRelatedSym.set(side);
      noRelatedSym.set(orderQty);
      noRelatedSym.set(currency);
      noRelatedSym.set(ordType);
      massQuote.addGroup(noRelatedSym);
      noRelatedSym.clear();
    }
  }

  return GetTickCount() - start;
}